

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner2.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::IGXMLScanner::parseSchemaLocation
          (IGXMLScanner *this,XMLCh *schemaLocationStr,bool ignoreLoadSchema)

{
  ulong uVar1;
  int iVar2;
  XMLCh *pXVar3;
  undefined4 extraout_var;
  char16_t **ppcVar4;
  ulong getAt;
  XMLBuffer normalBuf;
  ArrayJanitor<char16_t> janLoc;
  XMLBuffer local_78;
  ArrayJanitor<char16_t> local_40;
  
  pXVar3 = XMLString::replicate(schemaLocationStr,(this->super_XMLScanner).fMemoryManager);
  ArrayJanitor<char16_t>::ArrayJanitor(&local_40,pXVar3,(this->super_XMLScanner).fMemoryManager);
  processSchemaLocation(this,pXVar3);
  uVar1 = this->fLocationPairs->fCurCount;
  if ((uVar1 & 1) == 0) {
    local_78.fMemoryManager = (this->super_XMLScanner).fMemoryManager;
    local_78.fIndex = 0;
    local_78.fCapacity = 0x3ff;
    local_78.fFullSize = 0;
    local_78.fUsed = false;
    local_78.fFullHandler = (XMLBufferFullHandler *)0x0;
    iVar2 = (*(local_78.fMemoryManager)->_vptr_MemoryManager[3])(local_78.fMemoryManager,0x800);
    local_78.fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar2);
    *local_78.fBuffer = L'\0';
    for (getAt = 0; getAt < uVar1; getAt = getAt + 2) {
      ppcVar4 = ValueVectorOf<char16_t_*>::elementAt(this->fLocationPairs,getAt);
      normalizeAttRawValue(this,(XMLCh *)SchemaSymbols::fgXSI_SCHEMALOCATION,*ppcVar4,&local_78);
      ppcVar4 = ValueVectorOf<char16_t_*>::elementAt(this->fLocationPairs,getAt + 1);
      pXVar3 = *ppcVar4;
      local_78.fBuffer[local_78.fIndex] = L'\0';
      resolveSchemaGrammar(this,pXVar3,local_78.fBuffer,ignoreLoadSchema);
    }
    XMLBuffer::~XMLBuffer(&local_78);
  }
  else {
    XMLScanner::emitError(&this->super_XMLScanner,BadSchemaLocation);
  }
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
  return;
}

Assistant:

void IGXMLScanner::parseSchemaLocation(const XMLCh* const schemaLocationStr, bool ignoreLoadSchema)
{
    XMLCh* locStr = XMLString::replicate(schemaLocationStr, fMemoryManager);
    ArrayJanitor<XMLCh> janLoc(locStr, fMemoryManager);

    processSchemaLocation(locStr);
    XMLSize_t size = fLocationPairs->size();

    if (size % 2 != 0 ) {
        emitError(XMLErrs::BadSchemaLocation);
    } else {
        // We need a buffer to normalize the attribute value into
        XMLBuffer normalBuf(1023, fMemoryManager);
        for(XMLSize_t i=0; i<size; i=i+2) {
            normalizeAttRawValue(SchemaSymbols::fgXSI_SCHEMALOCATION, fLocationPairs->elementAt(i), normalBuf);
            resolveSchemaGrammar(fLocationPairs->elementAt(i+1), normalBuf.getRawBuffer(), ignoreLoadSchema);
        }
    }
}